

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bcrypt.c
# Opt level: O0

void bcrypt_hash(uchar *key,int keybytes,uchar *salt,int saltbytes,uchar *output)

{
  BlowfishContext *ctx_00;
  int local_3c;
  int i;
  BlowfishContext *ctx;
  uchar *output_local;
  int saltbytes_local;
  uchar *salt_local;
  int keybytes_local;
  uchar *key_local;
  
  ctx_00 = bcrypt_setup(key,keybytes,salt,saltbytes);
  builtin_memcpy(output,"cyxOmorhcitawolBhsiftawSanyDetim",0x20);
  for (local_3c = 0; local_3c < 0x40; local_3c = local_3c + 1) {
    blowfish_lsb_encrypt_ecb(output,0x20,ctx_00);
  }
  blowfish_free_context(ctx_00);
  return;
}

Assistant:

void bcrypt_hash(const unsigned char *key, int keybytes,
                 const unsigned char *salt, int saltbytes,
                 unsigned char output[32])
{
    BlowfishContext *ctx;
    int i;

    ctx = bcrypt_setup(key, keybytes, salt, saltbytes);
    /* This was quite a nice starting string until it ran into
     * little-endian Blowfish :-/ */
    memcpy(output, "cyxOmorhcitawolBhsiftawSanyDetim", 32);
    for (i = 0; i < 64; i++) {
        blowfish_lsb_encrypt_ecb(output, 32, ctx);
    }
    blowfish_free_context(ctx);
}